

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

void mxx::impl::
     samplesort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,long end,
               comm *param_3)

{
  bool bVar1;
  unsigned_long global_size;
  ulong uVar2;
  ulong __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  size_t local_size;
  vector<int,_std::allocator<int>_> recv_elements;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<int,_std::allocator<int>_> local_splitters;
  blk_dist mypart;
  allocator_type local_d9;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  ulong local_c0;
  _Vector_base<int,_std::allocator<int>_> local_b8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  _Vector_base<int,_std::allocator<int>_> local_88;
  blk_dist_buf local_68;
  
  uVar2 = (ulong)param_3->m_size;
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
            ();
  if (uVar2 != 1) {
    local_c0 = end - (long)begin._M_current >> 2;
    global_size = allreduce<unsigned_long,std::plus<unsigned_long>>(&local_c0,param_3);
    blk_dist_buf::blk_dist_buf(&local_68,global_size,param_3);
    bVar1 = all_of(local_c0 == local_68.m_local_size,param_3);
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (bVar1) {
      sample_block_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (&local_d8,(impl *)begin._M_current,end,uVar2 - 1,param_3);
    }
    else {
      sample_arbit_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (&local_d8,(impl *)begin._M_current,end,uVar2 - 1,param_3);
    }
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              ((vector<int,_std::allocator<int>_> *)&local_88,&local_d8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_d8);
    local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    split<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (&local_a0,(impl *)begin._M_current,end,&local_88,param_3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,&local_a0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
    all2all<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,param_3);
    __n = 0;
    for (; local_a0._M_impl.super__Vector_impl_data._M_start !=
           local_a0._M_impl.super__Vector_impl_data._M_finish;
        local_a0._M_impl.super__Vector_impl_data._M_start =
             local_a0._M_impl.super__Vector_impl_data._M_start + 1) {
      __n = __n + *local_a0._M_impl.super__Vector_impl_data._M_start;
    }
    if (((bVar1) && (uVar2 < local_c0)) && (local_c0 * 2 < __n)) {
      assert_fail("!_AssumeBlockDecomp || (local_size <= (size_t)p || recv_n <= 2* local_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                  ,0x16b,"samplesort");
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_b8,__n,&local_d9);
    all2allv<int>(begin._M_current,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                  local_b8._M_impl.super__Vector_impl_data._M_start,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a0,param_3);
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
              (local_b8._M_impl.super__Vector_impl_data._M_start,
               local_b8._M_impl.super__Vector_impl_data._M_finish);
    if (bVar1) {
      stable_distribute<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_b8._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_b8._M_impl.super__Vector_impl_data._M_finish,begin,param_3);
    }
    else {
      redo_arbit_decomposition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_b8._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_b8._M_impl.super__Vector_impl_data._M_finish,begin,local_c0,param_3);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  }
  return;
}

Assistant:

void samplesort(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm) {
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    int p = comm.size();

    SS_TIMER_START(comm);

    // perform local (stable) sorting
    if (_Stable)
        std::stable_sort(begin, end, comp);
    else
        std::sort(begin, end, comp);

    // sequential case: we're done
    if (p == 1)
        return;

#if SS_ENABLE_TIMER
    MPI_Barrier(comm);
#endif
    SS_TIMER_END_SECTION("local_sort");


    // local size
    size_t local_size = std::distance(begin, end);

    // check if we have a perfect block decomposition
    size_t global_size = mxx::allreduce(local_size, comm);
    blk_dist mypart(global_size, comm);
    bool _AssumeBlockDecomp = mxx::all_of(local_size == mypart.local_size(), comm);

    // sample sort
    // 1. local sort
    // 2. pick `s` samples regularly spaced on each processor
    // 3. bitonic sort samples
    // 4. allgather the last sample of each process -> splitters
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears twice, then split evenly)
    //    => send_counts
    // 6. distribute send_counts with all2all to get recv_counts
    // 7. allocate enough space (may be more than previously allocated) for receiving
    // 8. all2allv
    // 9. local reordering (multiway-merge or again std::sort)
    // A. equalizing distribution into original size (e.g.,block decomposition)
    //    by sending elements to neighbors

    // get splitters, using the method depending on whether the input consists
    // of arbitrary decompositions or not
    std::vector<value_type> local_splitters;
    // number of samples
    size_t s = p-1;
    if(_AssumeBlockDecomp)
        local_splitters = sample_block_decomp(begin, end, comp, s, comm);
    else
        local_splitters = sample_arbit_decomp(begin, end, comp, s, comm);
    SS_TIMER_END_SECTION("get_splitters");

    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    std::vector<size_t> send_counts;
    if (_Stable)
        send_counts = stable_split(begin, end, comp, local_splitters, comm);
    else
        send_counts = split(begin, end, comp, local_splitters, comm);
    SS_TIMER_END_SECTION("send_counts");


    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    size_t recv_n = std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0));
    MXX_ASSERT(!_AssumeBlockDecomp || (local_size <= (size_t)p || recv_n <= 2* local_size));
    std::vector<value_type> recv_elements(recv_n);
    // TODO: use collective with iterators [begin,end) instead of pointers!
    mxx::all2allv(&(*begin), send_counts, &(*recv_elements.begin()), recv_counts, comm);
    SS_TIMER_END_SECTION("all2all");

    // 9. local reordering
    /* multiway-merge (using the implementation in __gnu_parallel) */
#ifdef MXX_USE_GCC_MULTIWAY_MERGE
    if (!_Stable && local_size > (size_t)p*p) {
        // prepare the sequence offsets
        typedef typename std::vector<value_type>::iterator val_it;
        std::vector<std::pair<val_it, val_it> > seqs(p);
        std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
        for (int i = 0; i < p; ++i) {
            seqs[i].first = recv_elements.begin() + recv_displs[i];
            seqs[i].second = seqs[i].first + recv_counts[i];
        }
        val_it start_merge_it = recv_elements.begin();

        size_t merge_n = local_size;
        value_type* merge_buf_begin = &(*begin);
        std::vector<value_type> merge_buf;
        // TODO: reasonable values for the buffer?
        // currently: at least 1/10 th of the size to merge or 1 MiB
        if (local_size == 0 || local_size < recv_n / 10)
        {
            // at least 1MB buffer
            merge_n = std::max<size_t>(recv_n / 10, (1024*1024)/sizeof(value_type));
            merge_buf.resize(merge_n);
            merge_buf_begin = &merge_buf[0];
        }
        for (; recv_n > 0;)
        {
            if (recv_n < merge_n)
                merge_n = recv_n;
            // i)   merge at most `local_size` many elements sequentially
            __gnu_parallel::sequential_tag seq_tag;
            __gnu_parallel::multiway_merge(seqs.begin(), seqs.end(), merge_buf_begin, merge_n, comp, seq_tag);

            // ii)  compact the remaining elements in `recv_elements`
            for (int i = p-1; i > 0; --i)
            {
                seqs[i-1].first = std::copy_backward(seqs[i-1].first, seqs[i-1].second, seqs[i].first);
                seqs[i-1].second = seqs[i].first;
            }
            // iii) copy the output buffer `local_size` elements back into
            //      `recv_elements`
            start_merge_it = std::copy(merge_buf_begin, merge_buf_begin + merge_n, start_merge_it);
            assert(start_merge_it == seqs[0].first);

            // reduce the number of elements to be merged
            recv_n -= merge_n;
        }
        // clean up
        merge_buf.clear(); merge_buf.shrink_to_fit();
    } else
#endif
    {
        if (_Stable)
            std::stable_sort(recv_elements.begin(), recv_elements.end(), comp);
        else
            std::sort(recv_elements.begin(), recv_elements.end(), comp);
    }

#if SS_ENABLE_TIMER
    MPI_Barrier(comm);
#endif
    SS_TIMER_END_SECTION("local_merge");

    // A. equalizing distribution into original size (e.g.,block decomposition)
    //    by elements to neighbors
    //    and save elements into the original iterator positions
    if (_AssumeBlockDecomp)
        stable_distribute(recv_elements.begin(), recv_elements.end(), begin, comm);
    else
        redo_arbit_decomposition(recv_elements.begin(), recv_elements.end(), begin, local_size, comm);

    SS_TIMER_END_SECTION("fix_partition");
}